

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_ecdsa_adaptor.cpp
# Opt level: O2

ByteData * __thiscall
cfd::core::AdaptorSignature::Decrypt
          (ByteData *__return_storage_ptr__,AdaptorSignature *this,Privkey *sk)

{
  pointer deckey32;
  bool bVar1;
  int iVar2;
  secp256k1_context_struct *ctx;
  CfdException *pCVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> signature;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  secp256k1_ecdsa_signature secp_signature;
  
  bVar1 = IsValid(this);
  if (!bVar1) {
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&secp_signature,"Invalid adaptor signature.",(allocator *)&signature);
    CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)&secp_signature);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ctx = wally_get_secp_context();
  Privkey::GetData((ByteData *)&local_a0,sk);
  ByteData::GetBytes(&signature,(ByteData *)&local_a0);
  deckey32 = signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88,&this->data_
                    );
  iVar2 = secp256k1_ecdsa_adaptor_decrypt
                    (ctx,&secp_signature,deckey32,local_88._M_impl.super__Vector_impl_data._M_start)
  ;
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_88);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a0);
  if (iVar2 == 1) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&signature,0x40,
               (allocator_type *)&local_a0);
    secp256k1_ecdsa_signature_serialize_compact
              (ctx,signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,&secp_signature);
    ByteData::ByteData(__return_storage_ptr__,&signature);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return __return_storage_ptr__;
  }
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&signature,"Could not adapt signature.",(allocator *)&local_a0);
  CfdException::CfdException(pCVar3,kCfdInternalError,(string *)&signature);
  __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData AdaptorSignature::Decrypt(const Privkey &sk) const {
  if (!IsValid()) {
    throw CfdException(
        CfdError::kCfdIllegalStateError, "Invalid adaptor signature.");
  }
  auto ctx = wally_get_secp_context();
  secp256k1_ecdsa_signature secp_signature;
  auto ret = secp256k1_ecdsa_adaptor_decrypt(
      ctx, &secp_signature, sk.GetData().GetBytes().data(),
      data_.GetBytes().data());

  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not adapt signature.");
  }

  std::vector<uint8_t> signature(64);
  secp256k1_ecdsa_signature_serialize_compact(
      ctx, signature.data(), &secp_signature);

  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not serialize signature.");
  }
  return ByteData(signature);
}